

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  char **ppcVar4;
  char *__format;
  bool bVar5;
  int local_44;
  code *local_40;
  
  ctx = bidi_new_context();
  ppcVar4 = argv + 1;
  bVar2 = false;
  bVar5 = true;
  local_40 = (code *)0x0;
  local_44 = 0;
  do {
    if (argc < 2) {
      if (bVar2) {
        printf("pass %d fail %d total %d\n",(ulong)(uint)pass,(ulong)(uint)fail,
               (ulong)(uint)(fail + pass));
        bidi_free_context(ctx);
        return (uint)(fail != 0);
      }
      main_cold_1();
      return 1;
    }
    __s1 = *ppcVar4;
    if (((bVar5) && (*__s1 == '-')) && (__s1[1] != '\0')) {
      iVar3 = strcmp(__s1,"--");
      bVar1 = true;
      if (iVar3 == 0) {
        bVar5 = false;
      }
      else {
        iVar3 = strcmp(__s1,"--class");
        if (iVar3 == 0) {
          local_40 = class_test;
        }
        else {
          iVar3 = strcmp(__s1,"--char");
          if (iVar3 == 0) {
            local_40 = char_test;
          }
          else {
            iVar3 = strcmp(__s1,"--help");
            if (iVar3 != 0) {
              bVar1 = false;
              __format = "unrecognised option \'%s\'\n";
              goto LAB_0010147a;
            }
            fwrite("usage:   bidi_test ( ( --class | --char ) infile... )...\ne.g.:    bidi_test --class BidiTest.txt --char BidiCharacterTest.txt\nalso:    --help              display this text\n"
                   ,0xad,1,_stdout);
            bVar1 = false;
            local_44 = 0;
          }
        }
      }
    }
    else if (local_40 == (code *)0x0) {
      bVar1 = false;
      __format = "no mode argument provided before filename \'%s\'\n";
LAB_0010147a:
      fprintf(_stderr,__format,__s1);
      local_44 = 1;
    }
    else {
      iVar3 = strcmp(__s1,"-");
      if (iVar3 == 0) {
        (*local_40)("<standard input>",_stdin);
        bVar2 = true;
        bVar1 = true;
      }
      else {
        __stream = fopen(__s1,"r");
        bVar1 = __stream != (FILE *)0x0;
        if (__stream == (FILE *)0x0) {
          __format = "unable to open \'%s\'\n";
          goto LAB_0010147a;
        }
        (*local_40)(__s1,__stream);
        fclose(__stream);
        bVar2 = true;
      }
    }
    ppcVar4 = ppcVar4 + 1;
    argc = argc + -1;
    if (!bVar1) {
      return local_44;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    void (*testfn)(const char *, FILE *) = NULL;
    bool doing_opts = true;
    const char *filename = NULL;
    bool done_something = false;

    ctx = bidi_new_context();

    while (--argc > 0) {
        const char *arg = *++argv;
        if (doing_opts && arg[0] == '-' && arg[1]) {
            if (!strcmp(arg, "--")) {
                doing_opts = false;
            } else if (!strcmp(arg, "--class")) {
                testfn = class_test;
            } else if (!strcmp(arg, "--char")) {
                testfn = char_test;
            } else if (!strcmp(arg, "--help")) {
                usage(stdout);
                return 0;
            } else {
                fprintf(stderr, "unrecognised option '%s'\n", arg);
                return 1;
            }
        } else {
            const char *filename = arg;

            if (!testfn) {
                fprintf(stderr, "no mode argument provided before filename "
                        "'%s'\n", filename);
                return 1;
            }

            if (!strcmp(filename, "-")) {
                testfn("<standard input>", stdin);
            } else {
                FILE *fp = fopen(filename, "r");
                if (!fp) {
                    fprintf(stderr, "unable to open '%s'\n", filename);
                    return 1;
                }
                testfn(filename, fp);
                fclose(fp);
            }
            done_something = true;
        }
    }

    if (!done_something) {
        usage(stderr);
        return 1;
    }

    if (!filename)
        filename = "-";

    printf("pass %d fail %d total %d\n", pass, fail, pass + fail);

    bidi_free_context(ctx);
    return fail != 0;
}